

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::HasExplicitObjectName(cmGeneratorTarget *this,cmSourceFile *file)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  ComputeObjectMapping(this);
  p_Var2 = (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &(this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = &p_Var4->_M_header;
  p_Var3 = &p_Var4->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*(cmSourceFile **)(p_Var2 + 1) >= file) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(cmSourceFile **)(p_Var2 + 1) < file];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var4) &&
       (p_Var3 = p_Var1, file < *(cmSourceFile **)(p_Var1 + 1))) {
      p_Var3 = &p_Var4->_M_header;
    }
  }
  return (_Rb_tree_header *)p_Var3 != p_Var4;
}

Assistant:

bool cmGeneratorTarget::HasExplicitObjectName(cmSourceFile const* file) const
{
  const_cast<cmGeneratorTarget*>(this)->ComputeObjectMapping();
  std::set<cmSourceFile const*>::const_iterator it =
    this->ExplicitObjectName.find(file);
  return it != this->ExplicitObjectName.end();
}